

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

RPCHelpMan * getchaintxstats(void)

{
  string name;
  string name_00;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  Fallback fallback;
  Fallback fallback_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_09;
  string description_10;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  long lVar5;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  undefined4 in_stack_fffffffffffff1b8;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffff1bc;
  undefined8 in_stack_fffffffffffff1c0;
  undefined8 in_stack_fffffffffffff1c8;
  undefined8 in_stack_fffffffffffff1d0;
  _Manager_type in_stack_fffffffffffff1d8;
  undefined8 in_stack_fffffffffffff1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff1e8;
  pointer in_stack_fffffffffffff1f8;
  pointer pRVar7;
  pointer in_stack_fffffffffffff200;
  pointer pRVar8;
  pointer in_stack_fffffffffffff208;
  pointer pRVar9;
  undefined8 in_stack_fffffffffffff210;
  pointer in_stack_fffffffffffff218;
  pointer pRVar10;
  pointer in_stack_fffffffffffff220;
  pointer pRVar11;
  pointer in_stack_fffffffffffff228;
  pointer pRVar12;
  undefined8 in_stack_fffffffffffff230;
  pointer in_stack_fffffffffffff238;
  pointer pRVar13;
  pointer in_stack_fffffffffffff240;
  pointer pRVar14;
  pointer in_stack_fffffffffffff248;
  pointer pRVar15;
  undefined8 in_stack_fffffffffffff250;
  pointer in_stack_fffffffffffff258;
  pointer pRVar16;
  pointer in_stack_fffffffffffff260;
  pointer pRVar17;
  pointer in_stack_fffffffffffff268;
  undefined8 in_stack_fffffffffffff270;
  pointer in_stack_fffffffffffff278;
  pointer in_stack_fffffffffffff280;
  pointer in_stack_fffffffffffff288;
  undefined8 in_stack_fffffffffffff290;
  pointer in_stack_fffffffffffff298;
  allocator<char> local_d4a;
  allocator<char> local_d49;
  vector<RPCResult,_std::allocator<RPCResult>_> local_d48;
  allocator<char> local_d2a;
  allocator<char> local_d29;
  vector<RPCResult,_std::allocator<RPCResult>_> local_d28;
  allocator<char> local_d01;
  vector<RPCResult,_std::allocator<RPCResult>_> local_d00;
  allocator<char> local_ce2;
  allocator<char> local_ce1;
  RPCResults local_ce0;
  allocator_type local_cc7;
  allocator<char> local_cc6;
  allocator<char> local_cc5;
  allocator<char> local_cc4;
  allocator<char> local_cc3;
  allocator<char> local_cc2;
  allocator<char> local_cc1;
  vector<RPCArg,_std::allocator<RPCArg>_> local_cc0;
  allocator<char> local_ca2;
  allocator<char> local_ca1;
  string local_ca0;
  string local_c80;
  string local_c60;
  string local_c40;
  string local_c20;
  string local_c00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_be0;
  char *local_bc0;
  size_type local_bb8;
  char local_bb0 [8];
  undefined8 uStack_ba8;
  string local_ba0 [32];
  string local_b80 [32];
  string local_b60 [32];
  string local_b40 [32];
  string local_b20 [32];
  string local_b00 [32];
  string local_ae0 [32];
  string local_ac0 [32];
  string local_aa0 [32];
  string local_a80 [32];
  string local_a60 [32];
  string local_a40 [32];
  string local_a20 [32];
  string local_a00 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e0;
  string local_9c0 [32];
  RPCResult local_9a0 [4];
  RPCResult local_780;
  RPCResult local_6f8;
  RPCResult local_670;
  RPCResult local_5e8;
  string local_560 [32];
  string local_540 [32];
  RPCResult local_520;
  RPCArgOptions local_498;
  string local_450 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_410;
  string local_3b0 [32];
  RPCArgOptions local_390;
  string local_348 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_308;
  string local_2a8 [32];
  RPCArg local_288 [2];
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"getchaintxstats",&local_ca1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "\nCompute statistics about the total number and rate of transactions in the chain.\n",
             &local_ca2);
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"nblocks",&local_cc1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"one month",&local_cc2);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_308,&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            (local_348,"Size of the window in number of blocks",&local_cc3);
  local_390.oneline_description._M_dataplus._M_p = (pointer)&local_390.oneline_description.field_2;
  local_390.skip_type_check = false;
  local_390.oneline_description._M_string_length = 0;
  local_390.oneline_description.field_2._M_local_buf[0] = '\0';
  local_390.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_390.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_390.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_390.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_390._58_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff1bc;
  name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff1b8;
  name._M_string_length = in_stack_fffffffffffff1c0;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff1c8;
  name.field_2._8_8_ = in_stack_fffffffffffff1d0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff1e0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff1d8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff1e8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff1f8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff200;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff208;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff210;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff218;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff220;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff228;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff230;
  description_09._M_string_length = (size_type)in_stack_fffffffffffff240;
  description_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff238;
  description_09.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff248;
  description_09.field_2._8_8_ = in_stack_fffffffffffff250;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff260;
  opts._0_8_ = in_stack_fffffffffffff258;
  opts.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff268;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff270;
  opts.oneline_description.field_2._8_8_ = in_stack_fffffffffffff278;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff280;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff288;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff290;
  opts._64_8_ = in_stack_fffffffffffff298;
  RPCArg::RPCArg(local_288,name,(Type)local_2a8,fallback,description_09,opts);
  std::__cxx11::string::string<std::allocator<char>>(local_3b0,"blockhash",&local_cc4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"chain tip",&local_cc5);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_410,&local_430);
  std::__cxx11::string::string<std::allocator<char>>
            (local_450,"The hash of the block that ends the window.",&local_cc6);
  local_498.oneline_description._M_dataplus._M_p = (pointer)&local_498.oneline_description.field_2;
  local_498.skip_type_check = false;
  local_498.oneline_description._M_string_length = 0;
  local_498.oneline_description.field_2._M_local_buf[0] = '\0';
  local_498.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_498.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_498.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_498.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_498._58_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff1bc;
  name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff1b8;
  name_00._M_string_length = in_stack_fffffffffffff1c0;
  name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff1c8;
  name_00.field_2._8_8_ = in_stack_fffffffffffff1d0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff1e0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff1d8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff1e8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff1f8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff200;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff208;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff210;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff218;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff220;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff228;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff230;
  description_10._M_string_length = (size_type)in_stack_fffffffffffff240;
  description_10._M_dataplus._M_p = (pointer)in_stack_fffffffffffff238;
  description_10.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff248;
  description_10.field_2._8_8_ = in_stack_fffffffffffff250;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff260;
  opts_00._0_8_ = in_stack_fffffffffffff258;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_fffffffffffff268;
  opts_00.oneline_description.field_2._M_allocated_capacity = in_stack_fffffffffffff270;
  opts_00.oneline_description.field_2._8_8_ = in_stack_fffffffffffff278;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff280;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff288;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff290;
  opts_00._64_8_ = in_stack_fffffffffffff298;
  RPCArg::RPCArg(local_288 + 1,name_00,(Type)local_3b0,fallback_00,description_10,opts_00);
  __l._M_len = 2;
  __l._M_array = local_288;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_cc0,__l,&local_cc7);
  std::__cxx11::string::string<std::allocator<char>>(local_540,"",&local_ce1);
  std::__cxx11::string::string<std::allocator<char>>(local_560,"",&local_ce2);
  std::__cxx11::string::string<std::allocator<char>>(local_9c0,"time",&local_d01);
  std::operator+(&local_9e0,"The timestamp for the final block in the window, expressed in ",
                 &UNIX_EPOCH_TIME_abi_cxx11_);
  local_d28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff1bc;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff1b8;
  m_key_name._M_string_length = in_stack_fffffffffffff1c0;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff1c8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff1d0;
  description._M_string_length = in_stack_fffffffffffff1e0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1d8;
  description.field_2 = in_stack_fffffffffffff1e8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff200;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff1f8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff208;
  RPCResult::RPCResult(local_9a0,NUM_TIME,m_key_name,description,inner,SUB81(local_9c0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_a00,"txcount",&local_d29);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a20,
             "The total number of transactions in the chain up to that point, if known. It may be unknown when using assumeutxo."
             ,&local_d2a);
  local_d48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar6 = 0;
  auVar1._4_8_ = in_stack_fffffffffffff1c0;
  auVar1._0_4_ = in_stack_fffffffffffff1bc;
  auVar1._12_8_ = in_stack_fffffffffffff1c8;
  auVar1._20_8_ = in_stack_fffffffffffff1d0;
  auVar1._28_4_ = 0;
  description_00._M_string_length = in_stack_fffffffffffff1e0;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1d8;
  description_00.field_2 = in_stack_fffffffffffff1e8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff200;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff1f8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff208;
  RPCResult::RPCResult
            (local_9a0 + 1,NUM,(string)(auVar1 << 0x20),false,description_00,inner_00,true);
  std::__cxx11::string::string<std::allocator<char>>(local_a40,"window_final_block_hash",&local_d49)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_a60,"The hash of the final block in the window",&local_d4a);
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff1bc;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar6;
  m_key_name_00._M_string_length = in_stack_fffffffffffff1c0;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff1c8;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff1d0;
  description_01._M_string_length = in_stack_fffffffffffff1e0;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1d8;
  description_01.field_2 = in_stack_fffffffffffff1e8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff200;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff1f8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff208;
  RPCResult::RPCResult
            (local_9a0 + 2,STR_HEX,m_key_name_00,description_01,inner_01,SUB81(local_a40,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_a80,"window_final_block_height",(allocator<char> *)&stack0xfffffffffffff297);
  std::__cxx11::string::string<std::allocator<char>>
            (local_aa0,"The height of the final block in the window.",
             (allocator<char> *)&stack0xfffffffffffff296);
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff1bc;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar6;
  m_key_name_01._M_string_length = in_stack_fffffffffffff1c0;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff1c8;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff1d0;
  description_02._M_string_length = in_stack_fffffffffffff1e0;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1d8;
  description_02.field_2 = in_stack_fffffffffffff1e8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff200;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff1f8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff208;
  RPCResult::RPCResult(local_9a0 + 3,NUM,m_key_name_01,description_02,inner_02,SUB81(local_a80,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_ac0,"window_block_count",(allocator<char> *)&stack0xfffffffffffff277);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ae0,"Size of the window in number of blocks",
             (allocator<char> *)&stack0xfffffffffffff276);
  pRVar16 = (pointer)0x0;
  pRVar17 = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff1bc;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar6;
  m_key_name_02._M_string_length = in_stack_fffffffffffff1c0;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff1c8;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff1d0;
  description_03._M_string_length = in_stack_fffffffffffff1e0;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1d8;
  description_03.field_2 = in_stack_fffffffffffff1e8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff200;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff1f8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff208;
  RPCResult::RPCResult(&local_780,NUM,m_key_name_02,description_03,inner_03,SUB81(local_ac0,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_b00,"window_interval",(allocator<char> *)&stack0xfffffffffffff257);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b20,
             "The elapsed time in the window in seconds. Only returned if \"window_block_count\" is > 0"
             ,(allocator<char> *)&stack0xfffffffffffff256);
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  auVar2._4_8_ = in_stack_fffffffffffff1c0;
  auVar2._0_4_ = in_stack_fffffffffffff1bc;
  auVar2._12_8_ = in_stack_fffffffffffff1c8;
  auVar2._20_8_ = in_stack_fffffffffffff1d0;
  auVar2._28_4_ = 0;
  description_04._M_string_length = in_stack_fffffffffffff1e0;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1d8;
  description_04.field_2 = in_stack_fffffffffffff1e8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff200;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff1f8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff208;
  RPCResult::RPCResult(&local_6f8,NUM,(string)(auVar2 << 0x20),false,description_04,inner_04,true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b40,"window_tx_count",(allocator<char> *)&stack0xfffffffffffff237);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b60,
             "The number of transactions in the window. Only returned if \"window_block_count\" is > 0 and if txcount exists for the start and end of the window."
             ,(allocator<char> *)&stack0xfffffffffffff236);
  pRVar10 = (pointer)0x0;
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  auVar3._4_8_ = in_stack_fffffffffffff1c0;
  auVar3._0_4_ = in_stack_fffffffffffff1bc;
  auVar3._12_8_ = in_stack_fffffffffffff1c8;
  auVar3._20_8_ = in_stack_fffffffffffff1d0;
  auVar3._28_4_ = 0;
  description_05._M_string_length = in_stack_fffffffffffff1e0;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1d8;
  description_05.field_2 = in_stack_fffffffffffff1e8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff200;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff1f8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff208;
  RPCResult::RPCResult
            (&local_670,NUM,(string)(auVar3 << 0x20),SUB81(local_b40,0),description_05,inner_05,true
            );
  std::__cxx11::string::string<std::allocator<char>>
            (local_b80,"txrate",(allocator<char> *)&stack0xfffffffffffff217);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ba0,
             "The average rate of transactions per second in the window. Only returned if \"window_interval\" is > 0 and if window_tx_count exists."
             ,(allocator<char> *)&stack0xfffffffffffff216);
  pRVar7 = (pointer)0x0;
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  uVar6 = 0;
  auVar4._4_8_ = in_stack_fffffffffffff1c0;
  auVar4._0_4_ = in_stack_fffffffffffff1bc;
  auVar4._12_8_ = in_stack_fffffffffffff1c8;
  auVar4._20_8_ = in_stack_fffffffffffff1d0;
  auVar4._28_4_ = 0;
  description_06._M_string_length = in_stack_fffffffffffff1e0;
  description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1d8;
  description_06.field_2._M_local_buf = in_stack_fffffffffffff1e8._M_local_buf;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult
            (&local_5e8,NUM,(string)(auVar4 << 0x20),SUB81(local_b80,0),description_06,inner_06,true
            );
  __l_00._M_len = 8;
  __l_00._M_array = local_9a0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_d00,__l_00,(allocator_type *)&stack0xfffffffffffff1f7);
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff1bc;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar6;
  m_key_name_03._M_string_length = in_stack_fffffffffffff1c0;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff1c8;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff1d0;
  description_07._M_string_length = in_stack_fffffffffffff1e0;
  description_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1d8;
  description_07.field_2 = in_stack_fffffffffffff1e8;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar8;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar7;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar9;
  RPCResult::RPCResult(&local_520,OBJ,m_key_name_03,description_07,inner_07,SUB81(local_540,0));
  result._4_4_ = in_stack_fffffffffffff1bc;
  result.m_type = uVar6;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff1c0;
  result.m_key_name._M_string_length = in_stack_fffffffffffff1c8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff1d0;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff1d8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff1e0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff1e8;
  result._64_8_ = pRVar7;
  result.m_description._M_dataplus._M_p = (pointer)pRVar8;
  result.m_description._M_string_length = (size_type)pRVar9;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff210;
  result.m_description.field_2._8_8_ = pRVar10;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar11;
  result.m_cond._M_string_length = (size_type)pRVar12;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff230;
  result.m_cond.field_2._8_8_ = pRVar13;
  RPCResults::RPCResults(&local_ce0,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c20,"getchaintxstats",(allocator<char> *)&stack0xfffffffffffff1f6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c40,"",(allocator<char> *)&stack0xfffffffffffff1f5);
  HelpExampleCli(&local_c00,&local_c20,&local_c40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c80,"getchaintxstats",(allocator<char> *)&stack0xfffffffffffff1f4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ca0,"2016",(allocator<char> *)&stack0xfffffffffffff1f3);
  HelpExampleRpc(&local_c60,&local_c80,&local_ca0);
  std::operator+(&local_be0,&local_c00,&local_c60);
  local_bc0 = local_bb0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_be0._M_dataplus._M_p == &local_be0.field_2) {
    uStack_ba8 = local_be0.field_2._8_8_;
  }
  else {
    local_bc0 = local_be0._M_dataplus._M_p;
  }
  local_bb8 = local_be0._M_string_length;
  local_be0._M_string_length = 0;
  local_be0.field_2._M_local_buf[0] = '\0';
  description_08._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:1725:9)>
       ::_M_invoke;
  description_08._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:1725:9)>
                ::_M_manager;
  description_08.field_2 = in_stack_fffffffffffff1e8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar7;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar9;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar10;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff210;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar11;
  examples.m_examples._M_string_length = in_stack_fffffffffffff230;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar12;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar13;
  examples.m_examples.field_2._8_8_ = pRVar14;
  fun.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffff250;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar15;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar16;
  fun._M_invoker = (_Invoker_type)pRVar17;
  local_be0._M_dataplus._M_p = (pointer)&local_be0.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff1c0,&stack0xfffffffffffff1c8)),
             description_08,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff1c8);
  std::__cxx11::string::~string((string *)&local_bc0);
  std::__cxx11::string::~string((string *)&local_be0);
  std::__cxx11::string::~string((string *)&local_c60);
  std::__cxx11::string::~string((string *)&local_ca0);
  std::__cxx11::string::~string((string *)&local_c80);
  std::__cxx11::string::~string((string *)&local_c00);
  std::__cxx11::string::~string((string *)&local_c40);
  std::__cxx11::string::~string((string *)&local_c20);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ce0.m_results);
  RPCResult::~RPCResult(&local_520);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_d00);
  lVar5 = 0x3b8;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_9a0[0].m_type + lVar5));
    lVar5 = lVar5 + -0x88;
  } while (lVar5 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff1f8);
  std::__cxx11::string::~string(local_ba0);
  std::__cxx11::string::~string(local_b80);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff218);
  std::__cxx11::string::~string(local_b60);
  std::__cxx11::string::~string(local_b40);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff238);
  std::__cxx11::string::~string(local_b20);
  std::__cxx11::string::~string(local_b00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff258);
  std::__cxx11::string::~string(local_ae0);
  std::__cxx11::string::~string(local_ac0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff278);
  std::__cxx11::string::~string(local_aa0);
  std::__cxx11::string::~string(local_a80);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff298);
  std::__cxx11::string::~string(local_a60);
  std::__cxx11::string::~string(local_a40);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_d48);
  std::__cxx11::string::~string(local_a20);
  std::__cxx11::string::~string(local_a00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_d28);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::__cxx11::string::~string(local_9c0);
  std::__cxx11::string::~string(local_560);
  std::__cxx11::string::~string(local_540);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_cc0);
  lVar5 = 0x108;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_288[0].m_names._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x108;
  } while (lVar5 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_498);
  std::__cxx11::string::~string(local_450);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string(local_3b0);
  RPCArgOptions::~RPCArgOptions(&local_390);
  std::__cxx11::string::~string(local_348);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_308);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getchaintxstats()
{
    return RPCHelpMan{"getchaintxstats",
                "\nCompute statistics about the total number and rate of transactions in the chain.\n",
                {
                    {"nblocks", RPCArg::Type::NUM, RPCArg::DefaultHint{"one month"}, "Size of the window in number of blocks"},
                    {"blockhash", RPCArg::Type::STR_HEX, RPCArg::DefaultHint{"chain tip"}, "The hash of the block that ends the window."},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::NUM_TIME, "time", "The timestamp for the final block in the window, expressed in " + UNIX_EPOCH_TIME},
                        {RPCResult::Type::NUM, "txcount", /*optional=*/true,
                         "The total number of transactions in the chain up to that point, if known. "
                         "It may be unknown when using assumeutxo."},
                        {RPCResult::Type::STR_HEX, "window_final_block_hash", "The hash of the final block in the window"},
                        {RPCResult::Type::NUM, "window_final_block_height", "The height of the final block in the window."},
                        {RPCResult::Type::NUM, "window_block_count", "Size of the window in number of blocks"},
                        {RPCResult::Type::NUM, "window_interval", /*optional=*/true, "The elapsed time in the window in seconds. Only returned if \"window_block_count\" is > 0"},
                        {RPCResult::Type::NUM, "window_tx_count", /*optional=*/true,
                         "The number of transactions in the window. "
                         "Only returned if \"window_block_count\" is > 0 and if txcount exists for the start and end of the window."},
                        {RPCResult::Type::NUM, "txrate", /*optional=*/true,
                         "The average rate of transactions per second in the window. "
                         "Only returned if \"window_interval\" is > 0 and if window_tx_count exists."},
                    }},
                RPCExamples{
                    HelpExampleCli("getchaintxstats", "")
            + HelpExampleRpc("getchaintxstats", "2016")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    ChainstateManager& chainman = EnsureAnyChainman(request.context);
    const CBlockIndex* pindex;
    int blockcount = 30 * 24 * 60 * 60 / chainman.GetParams().GetConsensus().nPowTargetSpacing; // By default: 1 month

    if (request.params[1].isNull()) {
        LOCK(cs_main);
        pindex = chainman.ActiveChain().Tip();
    } else {
        uint256 hash(ParseHashV(request.params[1], "blockhash"));
        LOCK(cs_main);
        pindex = chainman.m_blockman.LookupBlockIndex(hash);
        if (!pindex) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Block not found");
        }
        if (!chainman.ActiveChain().Contains(pindex)) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Block is not in main chain");
        }
    }

    CHECK_NONFATAL(pindex != nullptr);

    if (request.params[0].isNull()) {
        blockcount = std::max(0, std::min(blockcount, pindex->nHeight - 1));
    } else {
        blockcount = request.params[0].getInt<int>();

        if (blockcount < 0 || (blockcount > 0 && blockcount >= pindex->nHeight)) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid block count: should be between 0 and the block's height - 1");
        }
    }

    const CBlockIndex& past_block{*CHECK_NONFATAL(pindex->GetAncestor(pindex->nHeight - blockcount))};
    const int64_t nTimeDiff{pindex->GetMedianTimePast() - past_block.GetMedianTimePast()};

    UniValue ret(UniValue::VOBJ);
    ret.pushKV("time", (int64_t)pindex->nTime);
    if (pindex->m_chain_tx_count) {
        ret.pushKV("txcount", pindex->m_chain_tx_count);
    }
    ret.pushKV("window_final_block_hash", pindex->GetBlockHash().GetHex());
    ret.pushKV("window_final_block_height", pindex->nHeight);
    ret.pushKV("window_block_count", blockcount);
    if (blockcount > 0) {
        ret.pushKV("window_interval", nTimeDiff);
        if (pindex->m_chain_tx_count != 0 && past_block.m_chain_tx_count != 0) {
            const auto window_tx_count = pindex->m_chain_tx_count - past_block.m_chain_tx_count;
            ret.pushKV("window_tx_count", window_tx_count);
            if (nTimeDiff > 0) {
                ret.pushKV("txrate", double(window_tx_count) / nTimeDiff);
            }
        }
    }

    return ret;
},
    };
}